

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

void * cab_read_ahead_cfdata(archive_read *a,ssize_t *avail)

{
  lzx_br *br;
  z_streamp strm;
  lzx_stream *strm_00;
  char cVar1;
  undefined1 uVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  undefined4 *puVar10;
  bool bVar11;
  byte bVar12;
  wchar_t wVar13;
  int iVar14;
  wchar_t wVar15;
  wchar_t wVar16;
  void *pvVar17;
  void *pvVar18;
  int64_t iVar19;
  void *pvVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  undefined4 uVar26;
  uint uVar27;
  uint uVar28;
  ushort *puVar29;
  ulong uVar30;
  char *pcVar31;
  wchar_t wVar32;
  undefined4 uVar33;
  undefined1 *puVar34;
  uint uVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  int iVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  uchar *p;
  int iVar43;
  int *piVar44;
  uint uVar45;
  undefined1 *__dest;
  size_t __n;
  void *pvVar46;
  ssize_t bytes_avail;
  ssize_t bytes_avail_1;
  uint local_154;
  uint local_140;
  uint local_13c;
  uint local_12c;
  lzx_br local_e8 [5];
  ulong local_98;
  byte *local_90;
  long local_88;
  ulong local_80;
  uint local_78;
  int local_74;
  long local_70;
  long local_68;
  long local_60;
  undefined4 *local_58;
  long local_50;
  long local_48;
  size_t local_40;
  long local_38;
  
  pvVar17 = a->format->data;
  wVar13 = cab_next_cfdata(a);
  if (wVar13 < L'\0') {
    *avail = (long)wVar13;
    return (void *)0x0;
  }
  lVar7 = *(long *)((long)pvVar17 + 0x28);
  sVar3 = *(short *)(lVar7 + 6);
  if (sVar3 != 3) {
    if (sVar3 != 1) {
      if (sVar3 != 0) {
        archive_set_error(&a->archive,0x54,"Unsupported CAB compression : %s",
                          *(undefined8 *)(lVar7 + 0x10));
        *avail = -0x19;
        return (void *)0x0;
      }
      lVar7 = *(long *)((long)a->format->data + 0x38);
      pvVar17 = __archive_read_ahead(a,1,avail);
      if (0 < *avail) {
        if ((long)(ulong)*(ushort *)(lVar7 + 10) < *avail) {
          *avail = (ulong)*(ushort *)(lVar7 + 10);
        }
        *(undefined2 *)(lVar7 + 0xc) = *(undefined2 *)(lVar7 + 8);
        *(ssize_t *)(lVar7 + 0x10) = *avail;
        *(void **)(lVar7 + 0x38) = pvVar17;
        return pvVar17;
      }
      pcVar31 = "Truncated CAB header";
      iVar14 = 0x54;
      goto LAB_00170753;
    }
    pvVar17 = a->format->data;
    lVar7 = *(long *)((long)pvVar17 + 0x38);
    if (*(long *)((long)pvVar17 + 0xa0) == 0) {
      *(undefined8 *)((long)pvVar17 + 0xa8) = 0x8000;
      pvVar18 = malloc(0x8000);
      *(void **)((long)pvVar17 + 0xa0) = pvVar18;
      if (pvVar18 == (void *)0x0) goto LAB_0017039a;
    }
    uVar4 = *(ushort *)(lVar7 + 0xc);
    if (uVar4 == *(ushort *)(lVar7 + 8)) {
      uVar5 = *(ushort *)(lVar7 + 0xe);
      lVar7 = *(long *)((long)pvVar17 + 0xa0);
      *avail = (ulong)uVar4 - (ulong)uVar5;
      return (void *)((ulong)uVar5 + lVar7);
    }
    if (*(char *)(*(long *)((long)pvVar17 + 0x28) + 0x5c) == '\0') {
      *(undefined8 *)((long)pvVar17 + 0x110) = 0;
      *(undefined4 *)((long)pvVar17 + 0x118) = 0;
      *(undefined8 *)((long)pvVar17 + 0x138) = 0;
      *(undefined8 *)((long)pvVar17 + 0x120) = 0;
      *(undefined8 *)((long)pvVar17 + 0x128) = 0;
      *(undefined4 *)((long)pvVar17 + 0x130) = 0;
      if (*(char *)((long)pvVar17 + 0x180) == '\0') {
        iVar14 = cm_zlib_inflateInit2_((z_streamp)((long)pvVar17 + 0x110),-0xf,"1.2.3",0x70);
      }
      else {
        iVar14 = cm_zlib_inflateReset((z_streamp)((long)pvVar17 + 0x110));
      }
      if (iVar14 != 0) {
        archive_set_error(&a->archive,-1,"Can\'t initialize deflate decompression.");
LAB_0017071f:
        *avail = -0x1e;
        return (void *)0x0;
      }
      *(undefined1 *)((long)pvVar17 + 0x180) = 1;
      *(undefined1 *)(*(long *)((long)pvVar17 + 0x28) + 0x5c) = 1;
    }
    uVar45 = (uint)(*(short *)(lVar7 + 6) == *(short *)(lVar7 + 4)) * 2;
    strm = (z_streamp)((long)pvVar17 + 0x110);
    *(ulong *)((long)pvVar17 + 0x138) = (ulong)uVar4;
    iVar14 = 0;
LAB_0016ebd2:
    uVar23 = *(ulong *)((long)pvVar17 + 0x138);
    uVar4 = *(ushort *)(lVar7 + 8);
    if (uVar23 < uVar4) {
      *(ulong *)((long)pvVar17 + 0x128) = *(long *)((long)pvVar17 + 0xa0) + uVar23;
      *(uint *)((long)pvVar17 + 0x130) = (uint)uVar4 - (int)uVar23;
      pcVar31 = (char *)__archive_read_ahead(a,1,(ssize_t *)local_e8);
      if ((long)local_e8[0].cache_buffer < 1) {
        bVar11 = false;
        archive_set_error(&a->archive,0x54,"Truncated CAB header");
        *avail = -0x1e;
        uVar26 = 1;
      }
      else {
        if ((long)(ulong)*(ushort *)(lVar7 + 6) < (long)local_e8[0].cache_buffer) {
          local_e8[0].cache_buffer = (ulong)*(ushort *)(lVar7 + 6);
        }
        *(char **)((long)pvVar17 + 0x110) = pcVar31;
        *(int *)((long)pvVar17 + 0x118) = (int)local_e8[0].cache_buffer;
        *(undefined8 *)((long)pvVar17 + 0x120) = 0;
        if ((int)uVar45 < 1) {
LAB_0016ecf0:
          iVar14 = cm_zlib_inflate(strm,0);
          if (iVar14 == 0) {
            bVar11 = false;
          }
          else {
            uVar26 = 6;
            if (iVar14 != 1) {
LAB_0016eda0:
              bVar11 = false;
              goto LAB_0016edde;
            }
            bVar11 = true;
          }
          iVar19 = *(int64_t *)((long)pvVar17 + 0x120);
          *(int64_t *)(lVar7 + 0x10) = iVar19;
          *(char **)(lVar7 + 0x38) = pcVar31;
          iVar19 = cab_minimum_consume_cfdata(a,iVar19);
          if (iVar19 < 0) {
            *avail = -0x1e;
            uVar26 = 1;
          }
          else {
            uVar26 = 0;
          }
        }
        else {
          uVar23 = (ulong)uVar45;
          if ((long)uVar23 < (long)local_e8[0].cache_buffer) {
            if ((uVar45 == 1) && (*pcVar31 != 'K')) {
              uVar26 = 4;
              uVar45 = 1;
            }
            else {
              uVar26 = 4;
              if (*pcVar31 == 'C') {
                if (pcVar31[1] == 'K') {
                  *(char **)((long)pvVar17 + 0x110) = pcVar31 + uVar23;
                  *(uint *)((long)pvVar17 + 0x118) = (int)local_e8[0].cache_buffer - uVar45;
                  *(ulong *)((long)pvVar17 + 0x120) = uVar23;
                  uVar45 = 0;
                  goto LAB_0016ecf0;
                }
                goto LAB_0016eda0;
              }
            }
          }
          else if (uVar45 == 2) {
            uVar26 = 4;
            if ((*pcVar31 == 'C') && (((long)local_e8[0].cache_buffer < 2 || (pcVar31[1] == 'K'))))
            {
LAB_0016ed4e:
              *(uint64_t *)(lVar7 + 0x10) = local_e8[0].cache_buffer;
              *(char **)(lVar7 + 0x38) = pcVar31;
              iVar19 = cab_minimum_consume_cfdata(a,local_e8[0].cache_buffer);
              if (iVar19 < 0) {
                *avail = -0x1e;
                uVar26 = 1;
                bVar11 = false;
                goto LAB_0016edde;
              }
              uVar45 = uVar45 - (int)local_e8[0].cache_buffer;
              uVar26 = 2;
            }
            else {
              uVar45 = 2;
            }
          }
          else {
            if (*pcVar31 == 'K') goto LAB_0016ed4e;
            uVar26 = 4;
          }
          bVar11 = false;
        }
      }
LAB_0016edde:
      switch(uVar26) {
      case 0:
      case 2:
        goto switchD_0016edf7_caseD_0;
      default:
        goto LAB_00170762;
      case 4:
        pcVar31 = "CFDATA incorrect(no MSZIP signature)";
        goto LAB_0017074e;
      case 6:
        goto switchD_0016edf7_caseD_6;
      }
    }
    goto LAB_001703b1;
  }
  pvVar17 = a->format->data;
  lVar7 = *(long *)((long)pvVar17 + 0x38);
  if (*(long *)((long)pvVar17 + 0xa0) == 0) {
    *(undefined8 *)((long)pvVar17 + 0xa8) = 0x8000;
    pvVar18 = malloc(0x8000);
    *(void **)((long)pvVar17 + 0xa0) = pvVar18;
    if (pvVar18 == (void *)0x0) {
LAB_0017039a:
      pcVar31 = "No memory for CAB reader";
      iVar14 = 0xc;
      goto LAB_00170753;
    }
  }
  uVar4 = *(ushort *)(lVar7 + 0xc);
  uVar23 = (ulong)uVar4;
  if (uVar4 == *(ushort *)(lVar7 + 8)) {
    uVar4 = *(ushort *)(lVar7 + 0xe);
    lVar7 = *(long *)((long)pvVar17 + 0xa0);
    *avail = uVar23 - uVar4;
    return (void *)((ulong)uVar4 + lVar7);
  }
  if (*(char *)(*(long *)((long)pvVar17 + 0x28) + 0x5c) == '\0') {
    uVar5 = *(ushort *)(*(long *)((long)pvVar17 + 0x28) + 8);
    if (*(long *)((long)pvVar17 + 0x1b8) == 0) {
      pvVar18 = calloc(1,0x260);
      *(void **)((long)pvVar17 + 0x1b8) = pvVar18;
      if (pvVar18 != (void *)0x0) goto LAB_0017045d;
    }
    else {
LAB_0017045d:
      puVar10 = *(undefined4 **)((long)pvVar17 + 0x1b8);
      puVar10[0x97] = 0xffffffe7;
      if (0xfffffff8 < uVar5 - 0x16) {
        puVar10[0x97] = 0xffffffe2;
        iVar14 = puVar10[1];
        uVar45 = slots[uVar5 - 0xf];
        iVar22 = 1 << ((byte)uVar5 & 0x1f);
        puVar10[1] = iVar22;
        puVar10[2] = iVar22 + -1;
        if ((*(void **)(puVar10 + 4) == (void *)0x0) || (iVar14 != iVar22)) {
          free(*(void **)(puVar10 + 4));
          pvVar18 = malloc((long)(int)puVar10[1]);
          *(void **)(puVar10 + 4) = pvVar18;
          if (pvVar18 != (void *)0x0) {
            free(*(void **)(puVar10 + 0x18));
            pvVar18 = malloc((long)(int)uVar45 * 8);
            *(void **)(puVar10 + 0x18) = pvVar18;
            if (pvVar18 != (void *)0x0) {
              lzx_huffman_free((huffman *)(puVar10 + 0x5a));
              goto LAB_00170501;
            }
          }
        }
        else {
LAB_00170501:
          lVar24 = 0;
          do {
            *(int *)((long)&local_e8[0].cache_buffer + lVar24 * 4) = 1 << ((byte)lVar24 & 0x1f);
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x12);
          lVar24 = *(long *)(puVar10 + 0x18);
          uVar25 = 1;
          if (1 < (int)uVar45) {
            uVar25 = (ulong)uVar45;
          }
          uVar36 = 0;
          uVar41 = 0;
          uVar38 = 0;
          do {
            if (uVar41 == 0) {
              uVar38 = (uint)uVar36;
            }
            else {
              uVar38 = uVar38 + *(int *)((long)&local_e8[0].cache_buffer + (ulong)uVar41 * 4);
            }
            if (uVar41 < 0x11) {
              uVar41 = 0xfffffffe;
              uVar6 = uVar38;
              if (uVar38 != 0) {
                do {
                  uVar41 = uVar41 + 1;
                  bVar11 = 1 < uVar6;
                  uVar6 = (int)uVar6 >> 1;
                } while (bVar11);
              }
              if ((int)uVar41 < 1) {
                uVar41 = 0;
              }
            }
            *(uint *)(lVar24 + uVar36 * 8) = uVar38;
            *(uint *)(lVar24 + 4 + uVar36 * 8) = uVar41;
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar25);
          puVar10[6] = 0;
          *puVar10 = 0;
          *(undefined8 *)(puVar10 + 0x1a) = 0;
          puVar10[0x1c] = 0;
          puVar10[0x12] = 1;
          *(undefined8 *)(puVar10 + 0x10) = 0x100000001;
          wVar13 = lzx_huffman_init((huffman *)(puVar10 + 0x1e),8,L'\b');
          if ((((wVar13 == L'\0') &&
               (wVar13 = lzx_huffman_init((huffman *)(puVar10 + 0x78),0x14,L'\n'), wVar13 == L'\0'))
              && (wVar13 = lzx_huffman_init((huffman *)(puVar10 + 0x5a),
                                            (long)(int)(uVar45 * 8 + 0x100),L'\x10'),
                 wVar13 == L'\0')) &&
             (wVar13 = lzx_huffman_init((huffman *)(puVar10 + 0x3c),0xf9,L'\x10'), wVar13 == L'\0'))
          {
            puVar10[0x97] = 0;
            *(undefined1 *)(*(long *)((long)pvVar17 + 0x28) + 0x5c) = 1;
            goto LAB_0016ee30;
          }
        }
      }
    }
    pcVar31 = "Can\'t initialize LZX decompression.";
LAB_0017074e:
    iVar14 = -1;
LAB_00170753:
    archive_set_error(&a->archive,iVar14,pcVar31);
    *avail = -0x1e;
    return (void *)0x0;
  }
LAB_0016ee30:
  lVar24 = *(long *)((long)pvVar17 + 0x1b8);
  *(undefined4 *)(lVar24 + 0x70) = 0;
  *(undefined1 *)(lVar24 + 0x75) = 0;
  *(ulong *)((long)pvVar17 + 0x1b0) = uVar23;
  uVar25 = (ulong)*(ushort *)(lVar7 + 8);
  if (uVar4 < *(ushort *)(lVar7 + 8)) {
    strm_00 = (lzx_stream *)((long)pvVar17 + 0x188);
LAB_0016ee63:
    *(ulong *)((long)pvVar17 + 0x1a0) = uVar23 + *(long *)((long)pvVar17 + 0xa0);
    *(ulong *)((long)pvVar17 + 0x1a8) = uVar25 - uVar23;
    local_90 = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_80);
    if (0 < (long)local_80) {
      uVar23 = (ulong)*(ushort *)(lVar7 + 6);
      if ((long)uVar23 < (long)local_80) {
        local_80 = uVar23;
      }
      uVar25 = local_80;
      *(byte **)((long)pvVar17 + 0x188) = local_90;
      *(ulong *)((long)pvVar17 + 400) = local_80;
      *(undefined8 *)((long)pvVar17 + 0x198) = 0;
      piVar8 = *(int **)((long)pvVar17 + 0x1b8);
      uVar45 = piVar8[0x97];
      if (uVar45 == 0) {
        iVar14 = piVar8[0x1c];
        if ((0 < (long)local_80 && *(char *)((long)piVar8 + 0x75) != '\0') && iVar14 + -0x41 < -0x10
           ) {
          *(ulong *)(piVar8 + 0x1a) =
               (ulong)*(byte *)(piVar8 + 0x1d) |
               (ulong)*local_90 << 8 | *(long *)(piVar8 + 0x1a) << 0x10;
          *(byte **)((long)pvVar17 + 0x188) = local_90 + 1;
          *(ulong *)((long)pvVar17 + 400) = local_80 - 1;
          piVar8[0x1c] = iVar14 + 0x10;
          *(undefined1 *)((long)piVar8 + 0x75) = 0;
        }
        iVar14 = (uint)(local_80 == uVar23) * 4 + 1;
        local_78 = (local_80 == uVar23) + 7;
LAB_0016efab:
        if (0x11 < *piVar8) {
          local_38 = *(long *)((long)pvVar17 + 0x1a8);
          puVar10 = *(undefined4 **)((long)pvVar17 + 0x1b8);
          local_58 = puVar10 + 0x1a;
          local_e8[0].cache_buffer = *(uint64_t *)(puVar10 + 0x1a);
          local_e8[0].cache_avail = puVar10[0x1c];
          local_e8[0]._12_4_ = puVar10[0x1d];
          local_68 = *(long *)(puVar10 + 0x18);
          __dest = *(undefined1 **)((long)pvVar17 + 0x1a0);
          puVar34 = __dest + local_38;
          lVar24 = *(long *)(puVar10 + 4);
          local_70 = *(long *)(puVar10 + 0x30);
          local_60 = *(long *)(puVar10 + 0x4e);
          local_48 = *(long *)(puVar10 + 0x6c);
          uVar36 = *(ulong *)(puVar10 + 0xe);
          local_88 = (long)(int)puVar10[0x32];
          local_50 = (long)(int)puVar10[0x50];
          wVar13 = puVar10[0x6e];
          uVar38 = puVar10[8];
          cVar1 = *(char *)((long)puVar10 + 0x29);
          uVar41 = puVar10[6];
          uVar6 = puVar10[2];
          local_74 = puVar10[1];
          uVar27 = puVar10[0x15];
          local_98 = (ulong)(uint)puVar10[0x17];
          local_154 = puVar10[0x16];
          local_13c = puVar10[0x10];
          uVar26 = *puVar10;
          uVar45 = puVar10[7];
          uVar21 = puVar10[0x12];
          uVar35 = puVar10[0x11];
switchD_0016f253_default:
          do {
            local_140 = uVar35;
            local_12c = uVar21;
            uVar28 = uVar45;
            uVar33 = uVar26;
            uVar26 = uVar33;
            uVar45 = uVar28;
            uVar21 = local_12c;
            uVar35 = local_140;
            switch(uVar33) {
            case 0x12:
              if (uVar36 != 0) {
                do {
                  if (puVar34 <= __dest) goto LAB_0016fb72;
                  if (((local_e8[0].cache_avail < wVar13) &&
                      (wVar32 = lzx_br_fillup(strm_00,local_e8), wVar32 == L'\0')) &&
                     (local_e8[0].cache_avail < wVar13)) {
                    if (uVar25 != uVar23) goto LAB_0016fb72;
                    uVar40 = (uint)(local_e8[0].cache_buffer <<
                                   ((char)wVar13 - (char)local_e8[0].cache_avail & 0x3fU)) &
                             cache_masks[wVar13];
                    uVar45 = puVar10[0x6f];
                    iVar22 = puVar10[0x5a];
                    uVar4 = *(ushort *)
                             (*(long *)(puVar10 + 0x74) +
                             (ulong)(uVar40 >> ((byte)uVar45 & 0x1f)) * 2);
                    uVar30 = (ulong)uVar4;
                    if (iVar22 <= (int)(uint)uVar4) {
                      uVar42 = uVar30;
                      do {
                        uVar30 = 0;
                        if (((int)uVar45 < 1) ||
                           (iVar39 = (int)uVar42 - iVar22, uVar30 = 0, (int)puVar10[0x71] <= iVar39)
                           ) break;
                        uVar45 = uVar45 - 1;
                        puVar29 = (ushort *)(*(long *)(puVar10 + 0x76) + 2 + (long)iVar39 * 4);
                        if ((uVar40 >> (uVar45 & 0x1f) & 1) != 0) {
                          puVar29 = (ushort *)(*(long *)(puVar10 + 0x76) + (long)iVar39 * 4);
                        }
                        uVar30 = (ulong)*puVar29;
                        uVar42 = uVar30;
                      } while (iVar22 <= (int)(uint)*puVar29);
                    }
                    uVar45 = (uint)uVar30;
                    local_e8[0].cache_avail =
                         local_e8[0].cache_avail - (uint)*(byte *)(local_48 + uVar30);
                    if (local_e8[0].cache_avail < L'\0') goto LAB_0017019f;
                  }
                  else {
                    uVar40 = (uint)(local_e8[0].cache_buffer >>
                                   ((char)local_e8[0].cache_avail - (char)wVar13 & 0x3fU)) &
                             cache_masks[wVar13];
                    uVar45 = puVar10[0x6f];
                    iVar22 = puVar10[0x5a];
                    uVar4 = *(ushort *)
                             (*(long *)(puVar10 + 0x74) +
                             (ulong)(uVar40 >> ((byte)uVar45 & 0x1f)) * 2);
                    uVar30 = (ulong)uVar4;
                    if (iVar22 <= (int)(uint)uVar4) {
                      uVar42 = uVar30;
                      do {
                        uVar30 = 0;
                        if (((int)uVar45 < 1) ||
                           (iVar39 = (int)uVar42 - iVar22, uVar30 = 0, (int)puVar10[0x71] <= iVar39)
                           ) break;
                        uVar45 = uVar45 - 1;
                        puVar29 = (ushort *)(*(long *)(puVar10 + 0x76) + 2 + (long)iVar39 * 4);
                        if ((uVar40 >> (uVar45 & 0x1f) & 1) != 0) {
                          puVar29 = (ushort *)(*(long *)(puVar10 + 0x76) + (long)iVar39 * 4);
                        }
                        uVar30 = (ulong)*puVar29;
                        uVar42 = uVar30;
                      } while (iVar22 <= (int)(uint)*puVar29);
                    }
                    uVar45 = (uint)uVar30;
                    local_e8[0].cache_avail =
                         local_e8[0].cache_avail - (uint)*(byte *)(local_48 + uVar30);
                  }
                  if (0xff < uVar45) goto LAB_0016f436;
                  *(char *)(lVar24 + (int)uVar41) = (char)uVar45;
                  uVar41 = uVar41 + 1 & uVar6;
                  *__dest = (char)uVar45;
                  __dest = __dest + 1;
                  uVar36 = uVar36 - 1;
                  if (uVar36 == 0) break;
                } while( true );
              }
              *puVar10 = 2;
              *local_58 = (int)local_e8[0].cache_buffer;
              local_58[1] = local_e8[0].cache_buffer._4_4_;
              local_58[2] = local_e8[0].cache_avail;
              local_58[3] = local_e8[0]._12_4_;
              *(undefined8 *)(puVar10 + 0xe) = 0;
              puVar10[8] = uVar38;
              puVar10[7] = uVar28;
              puVar10[0x15] = uVar27;
              puVar10[0x16] = local_154;
              puVar10[0x10] = local_13c;
              puVar10[0x11] = local_140;
              puVar10[0x12] = local_12c;
              puVar10[6] = uVar41;
              *(long *)((long)pvVar17 + 0x1a8) = (long)puVar34 - (long)__dest;
              uVar45 = 1;
              goto LAB_001701b4;
            case 0x13:
              goto LAB_0016f446;
            case 0x14:
              goto LAB_0016f675;
            case 0x15:
              uVar45 = local_13c;
              goto LAB_0016f924;
            case 0x16:
              goto switchD_0016f253_caseD_16;
            }
          } while( true );
        }
        piVar9 = *(int **)((long)pvVar17 + 0x1b8);
        br = (lzx_br *)(piVar9 + 0x1a);
switchD_0016efd6_default:
        switch(*piVar9) {
        case 0:
          if (((piVar9[0x1c] < 1) && (wVar13 = lzx_br_fillup(strm_00,br), wVar13 == L'\0')) &&
             (piVar9[0x1c] < 1)) {
            *piVar9 = 0;
            goto LAB_00170133;
          }
          *(bool *)(piVar9 + 10) =
               (*(ulong *)(piVar9 + 0x1a) >> ((ulong)(piVar9[0x1c] - 1U) & 0x3f) & 1) != 0;
          piVar9[0x1c] = piVar9[0x1c] - 1U;
          break;
        case 2:
          goto switchD_0016efd6_caseD_2;
        case 3:
          goto switchD_0016efd6_caseD_3;
        case 4:
          goto switchD_0016efd6_caseD_4;
        case 5:
        case 6:
        case 7:
          goto switchD_0016efd6_caseD_5;
        case 8:
          goto switchD_0016efd6_caseD_8;
        case 9:
          goto switchD_0016efd6_caseD_9;
        case 10:
          if (((SBORROW4(piVar9[0x1c],piVar9[0x1e] * 3) != piVar9[0x1c] + piVar9[0x1e] * -3 < 0) &&
              (wVar13 = lzx_br_fillup(strm_00,br), wVar13 == L'\0')) &&
             (SBORROW4(piVar9[0x1c],piVar9[0x1e] * 3) != piVar9[0x1c] + piVar9[0x1e] * -3 < 0)) {
            *piVar9 = 10;
            goto LAB_00170133;
          }
          piVar9[0x2b] = 0;
          piVar9[0x2c] = 0;
          piVar9[0x2d] = 0;
          piVar9[0x2e] = 0;
          piVar9[0x27] = 0;
          piVar9[0x28] = 0;
          piVar9[0x29] = 0;
          piVar9[0x2a] = 0;
          piVar9[0x23] = 0;
          piVar9[0x24] = 0;
          piVar9[0x25] = 0;
          piVar9[0x26] = 0;
          piVar9[0x1f] = 0;
          piVar9[0x20] = 0;
          piVar9[0x21] = 0;
          piVar9[0x22] = 0;
          piVar9[0x2f] = 0;
          if (0 < piVar9[0x1e]) {
            lVar24 = 0;
            do {
              *(byte *)(*(long *)(piVar9 + 0x30) + lVar24) =
                   (byte)(*(ulong *)(piVar9 + 0x1a) >> ((char)piVar9[0x1c] - 3U & 0x3f)) & 7;
              piVar9[(ulong)*(byte *)(*(long *)(piVar9 + 0x30) + lVar24) + 0x1f] =
                   piVar9[(ulong)*(byte *)(*(long *)(piVar9 + 0x30) + lVar24) + 0x1f] + 1;
              piVar9[0x1c] = piVar9[0x1c] + -3;
              lVar24 = lVar24 + 1;
            } while (lVar24 < piVar9[0x1e]);
          }
          wVar13 = lzx_make_huffman_table((huffman *)(piVar9 + 0x1e));
          if (wVar13 == L'\0') goto LAB_0017013f;
switchD_0016efd6_caseD_b:
          piVar9[0x96] = 0;
switchD_0016efd6_caseD_c:
          wVar13 = lzx_read_pre_tree(strm_00);
          if (wVar13 == L'\0') {
            *piVar9 = 0xc;
            goto LAB_00170133;
          }
          wVar13 = lzx_make_huffman_table((huffman *)(piVar9 + 0x78));
          if (wVar13 == L'\0') goto LAB_0017013f;
          piVar9[0x96] = 0;
switchD_0016efd6_caseD_d:
          wVar13 = lzx_read_bitlen(strm_00,(huffman *)(piVar9 + 0x5a),L'Ā');
          if (wVar13 < L'\0') goto LAB_0017013f;
          if (wVar13 == L'\0') {
            *piVar9 = 0xd;
            goto LAB_00170133;
          }
          piVar9[0x96] = 0;
switchD_0016efd6_caseD_e:
          wVar13 = lzx_read_pre_tree(strm_00);
          if (wVar13 == L'\0') {
            *piVar9 = 0xe;
            goto LAB_00170133;
          }
          wVar13 = lzx_make_huffman_table((huffman *)(piVar9 + 0x78));
          if (wVar13 == L'\0') goto LAB_0017013f;
          piVar9[0x96] = 0x100;
switchD_0016efd6_caseD_f:
          wVar13 = lzx_read_bitlen(strm_00,(huffman *)(piVar9 + 0x5a),L'\xffffffff');
          if (wVar13 < L'\0') goto LAB_0017013f;
          if (wVar13 == L'\0') {
            *piVar9 = 0xf;
            goto LAB_00170133;
          }
          wVar13 = lzx_make_huffman_table((huffman *)(piVar9 + 0x5a));
          if (wVar13 == L'\0') goto LAB_0017013f;
          piVar9[0x96] = 0;
switchD_0016efd6_caseD_10:
          wVar13 = lzx_read_pre_tree(strm_00);
          if (wVar13 == L'\0') {
            *piVar9 = 0x10;
            goto LAB_00170133;
          }
          wVar13 = lzx_make_huffman_table((huffman *)(piVar9 + 0x78));
          if (wVar13 == L'\0') goto LAB_0017013f;
          piVar9[0x96] = 0;
switchD_0016efd6_caseD_11:
          wVar13 = lzx_read_bitlen(strm_00,(huffman *)(piVar9 + 0x3c),L'\xffffffff');
          if (wVar13 < L'\0') goto LAB_0017013f;
          if (wVar13 == L'\0') {
            *piVar9 = 0x11;
            goto LAB_00170133;
          }
          wVar13 = lzx_make_huffman_table((huffman *)(piVar9 + 0x3c));
          if (wVar13 == L'\0') goto LAB_0017013f;
          *piVar9 = 0x12;
          uVar45 = 100;
          goto LAB_001701e0;
        case 0xb:
          goto switchD_0016efd6_caseD_b;
        case 0xc:
          goto switchD_0016efd6_caseD_c;
        case 0xd:
          goto switchD_0016efd6_caseD_d;
        case 0xe:
          goto switchD_0016efd6_caseD_e;
        case 0xf:
          goto switchD_0016efd6_caseD_f;
        case 0x10:
          goto switchD_0016efd6_caseD_10;
        case 0x11:
          goto switchD_0016efd6_caseD_11;
        default:
          goto switchD_0016efd6_default;
        }
        if ((char)piVar9[10] != '\0') {
          if (((piVar9[0x1c] < 0x20) && (wVar13 = lzx_br_fillup(strm_00,br), wVar13 == L'\0')) &&
             (piVar9[0x1c] < 0x20)) {
            *piVar9 = 1;
            goto LAB_00170133;
          }
          iVar22 = piVar9[0x1c] + -0x20;
          piVar9[9] = (uint)(*(ulong *)(piVar9 + 0x1a) >> ((byte)iVar22 & 0x3f)) & 0xffff |
                      (int)(*(ulong *)(piVar9 + 0x1a) >> ((char)piVar9[0x1c] - 0x10U & 0x3f)) <<
                      0x10;
          piVar9[0x1c] = iVar22;
        }
switchD_0016efd6_caseD_2:
        if (((piVar9[0x1c] < 3) && (wVar13 = lzx_br_fillup(strm_00,br), wVar13 == L'\0')) &&
           (piVar9[0x1c] < 3)) {
          *piVar9 = 2;
          goto LAB_00170133;
        }
        bVar12 = (byte)(*(ulong *)(piVar9 + 0x1a) >> ((byte)(piVar9[0x1c] + -3) & 0x3f)) & 7;
        *(byte *)((long)piVar9 + 0x29) = bVar12;
        piVar9[0x1c] = piVar9[0x1c] + -3;
        if (2 < (byte)(bVar12 - 1)) goto LAB_0017013f;
switchD_0016efd6_caseD_3:
        if (((piVar9[0x1c] < 0x18) && (wVar13 = lzx_br_fillup(strm_00,br), wVar13 == L'\0')) &&
           (piVar9[0x1c] < 0x18)) {
          *piVar9 = 3;
          goto LAB_00170133;
        }
        iVar22 = piVar9[0x1c] + -0x18;
        uVar36 = *(ulong *)(piVar9 + 0x1a) >> ((byte)iVar22 & 0x3f) & 0xffff |
                 (ulong)(((uint)(*(ulong *)(piVar9 + 0x1a) >> ((char)piVar9[0x1c] - 8U & 0x3f)) &
                         0xff) << 0x10);
        *(ulong *)(piVar9 + 0xc) = uVar36;
        piVar9[0x1c] = iVar22;
        if (uVar36 == 0) goto LAB_0017013f;
        *(ulong *)(piVar9 + 0xe) = uVar36;
        iVar22 = 0xb;
        if (*(char *)((long)piVar9 + 0x29) != '\x01') {
          if (*(char *)((long)piVar9 + 0x29) == '\x03') goto switchD_0016efd6_caseD_4;
          iVar22 = 10;
        }
        *piVar9 = iVar22;
        goto switchD_0016efd6_default;
      }
      goto LAB_001701fc;
    }
    pcVar31 = "Truncated CAB file data";
    goto LAB_00170790;
  }
LAB_0017024f:
  if (*(short *)(lVar7 + 6) == 0) {
LAB_001702a3:
    if ((10 < (ulong)*(ushort *)(lVar7 + 8)) &&
       (lVar24 = *(long *)((long)pvVar17 + 0x1b8), *(char *)(lVar24 + 0x28) != '\0')) {
      pvVar18 = *(void **)((long)pvVar17 + 0xa0);
      pvVar46 = (void *)((long)pvVar18 + ((ulong)*(ushort *)(lVar7 + 8) - 10));
      if (pvVar18 < pvVar46) {
        iVar14 = *(int *)(*(long *)((long)pvVar17 + 0x28) + 0x58);
        pvVar20 = pvVar18;
        do {
          pvVar20 = memchr(pvVar20,0xe8,(long)pvVar46 - (long)pvVar20);
          if (pvVar20 == (void *)0x0) break;
          iVar22 = ((int)pvVar18 - (int)pvVar20) + iVar14 * -0x8000 + 0x8000;
          uVar38 = (uint)*(byte *)((long)pvVar20 + 4) << 0x18;
          uVar45 = (uint)*(byte *)((long)pvVar20 + 2) << 8 |
                   (uint)*(byte *)((long)pvVar20 + 3) << 0x10 | (uint)*(byte *)((long)pvVar20 + 1) |
                   uVar38;
          if ((iVar22 <= (int)uVar45) && (iVar39 = *(int *)(lVar24 + 0x24), (int)uVar45 < iVar39)) {
            if ((int)uVar38 < 0) {
              iVar22 = iVar39;
            }
            *(uint *)((long)pvVar20 + 1) = iVar22 + uVar45;
          }
          pvVar20 = (void *)((long)pvVar20 + 5);
        } while (pvVar20 < pvVar46);
      }
    }
    uVar4 = *(ushort *)(lVar7 + 0xe);
    lVar24 = *(long *)((long)pvVar17 + 0xa0);
    *avail = (uVar23 & 0xffff) - (ulong)uVar4;
    *(short *)(lVar7 + 0xc) = (short)uVar23;
    return (void *)(lVar24 + (ulong)uVar4);
  }
  pvVar18 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar7 + 6),(ssize_t *)local_e8);
  if (0 < (long)local_e8[0].cache_buffer) {
    *(ulong *)(lVar7 + 0x10) = (ulong)*(ushort *)(lVar7 + 6);
    *(void **)(lVar7 + 0x38) = pvVar18;
    iVar19 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar7 + 6));
    if (-1 < iVar19) goto LAB_001702a3;
    goto LAB_001707ee;
  }
  pcVar31 = "Truncated CAB header";
LAB_00170790:
  iVar14 = 0x54;
LAB_00170798:
  archive_set_error(&a->archive,iVar14,pcVar31);
LAB_001707ee:
  *avail = -0x1e;
LAB_00170762:
  return (void *)0x0;
switchD_0016edf7_caseD_0:
  if (bVar11) goto LAB_001703b1;
  goto LAB_0016ebd2;
LAB_001703b1:
  uVar23 = *(ulong *)((long)pvVar17 + 0x138);
  uVar25 = uVar23 & 0xffff;
  if ((uint)uVar25 < (uint)*(ushort *)(lVar7 + 8)) {
    archive_set_error(&a->archive,-1,"Invalid uncompressed size (%d < %d)",uVar25);
    goto LAB_0017071f;
  }
  if (*(short *)(lVar7 + 6) != 0) {
    pvVar18 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar7 + 6),(ssize_t *)local_e8);
    if ((long)local_e8[0].cache_buffer < 1) {
      archive_set_error(&a->archive,0x54,"Truncated CAB header");
      goto LAB_001707ee;
    }
    *(ulong *)(lVar7 + 0x10) = (ulong)*(ushort *)(lVar7 + 6);
    *(void **)(lVar7 + 0x38) = pvVar18;
    iVar19 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar7 + 6));
    if (iVar19 < 0) goto LAB_001707ee;
  }
  if (((int)(uint)*(ushort *)(*(long *)((long)pvVar17 + 0x28) + 4) <=
       *(int *)(*(long *)((long)pvVar17 + 0x28) + 0x58)) ||
     ((iVar14 = cm_zlib_inflateReset(strm), iVar14 == 0 &&
      (iVar14 = cm_zlib_inflateSetDictionary
                          (strm,*(Bytef **)((long)pvVar17 + 0xa0),(uint)*(ushort *)(lVar7 + 8)),
      iVar14 == 0)))) {
    uVar4 = *(ushort *)(lVar7 + 0xe);
    lVar24 = *(long *)((long)pvVar17 + 0xa0);
    *avail = uVar25 - uVar4;
    *(short *)(lVar7 + 0xc) = (short)uVar23;
    return (void *)((ulong)uVar4 + lVar24);
  }
switchD_0016edf7_caseD_6:
  if (iVar14 != -4) {
    pcVar31 = "Deflate decompression failed (%d)";
LAB_001707a8:
    archive_set_error(&a->archive,-1,pcVar31);
    goto LAB_001707ee;
  }
  pcVar31 = "Out of memory for deflate decompression";
  iVar14 = 0xc;
  goto LAB_00170798;
LAB_0016f436:
  uVar27 = uVar45 & 7;
  local_154 = uVar45 - 0x100 >> 3;
LAB_0016f446:
  if (uVar27 == 7) {
    if (((local_e8[0].cache_avail < (wchar_t)local_50) &&
        (wVar32 = lzx_br_fillup(strm_00,local_e8), wVar32 == L'\0')) &&
       (local_e8[0].cache_avail < (wchar_t)local_50)) {
      if (uVar25 != uVar23) {
        uVar33 = 0x13;
        uVar27 = 7;
        goto LAB_0016fb72;
      }
      uVar40 = (uint)(local_e8[0].cache_buffer <<
                     ((char)local_50 - (char)local_e8[0].cache_avail & 0x3fU)) &
               cache_masks[local_50];
      uVar45 = puVar10[0x51];
      iVar22 = puVar10[0x3c];
      uVar4 = *(ushort *)(*(long *)(puVar10 + 0x56) + (ulong)(uVar40 >> ((byte)uVar45 & 0x1f)) * 2);
      uVar37 = (uint)uVar4;
      if ((int)(uint)uVar4 < iVar22) {
        uVar38 = (uint)uVar4;
      }
      else {
        do {
          uVar38 = 0;
          if (((int)uVar45 < 1) || (iVar39 = uVar37 - iVar22, (int)puVar10[0x53] <= iVar39)) break;
          uVar45 = uVar45 - 1;
          puVar29 = (ushort *)(*(long *)(puVar10 + 0x58) + 2 + (long)iVar39 * 4);
          if ((uVar40 >> (uVar45 & 0x1f) & 1) != 0) {
            puVar29 = (ushort *)(*(long *)(puVar10 + 0x58) + (long)iVar39 * 4);
          }
          uVar37 = (uint)*puVar29;
          uVar38 = uVar37;
        } while (iVar22 <= (int)uVar37);
      }
      local_e8[0].cache_avail = local_e8[0].cache_avail - (uint)*(byte *)(local_60 + (ulong)uVar38);
      if (local_e8[0].cache_avail < L'\0') goto LAB_0017019f;
    }
    else {
      uVar38 = (uint)(local_e8[0].cache_buffer >>
                     ((char)local_e8[0].cache_avail - (char)local_50 & 0x3fU)) &
               cache_masks[local_50];
      uVar45 = puVar10[0x51];
      iVar22 = puVar10[0x3c];
      uVar4 = *(ushort *)(*(long *)(puVar10 + 0x56) + (ulong)(uVar38 >> ((byte)uVar45 & 0x1f)) * 2);
      uVar40 = (uint)uVar4;
      if ((int)(uint)uVar4 < iVar22) {
        uVar30 = (ulong)uVar4;
      }
      else {
        do {
          uVar30 = 0;
          if (((int)uVar45 < 1) || (iVar39 = uVar40 - iVar22, (int)puVar10[0x53] <= iVar39)) break;
          uVar45 = uVar45 - 1;
          puVar29 = (ushort *)(*(long *)(puVar10 + 0x58) + 2 + (long)iVar39 * 4);
          if ((uVar38 >> (uVar45 & 0x1f) & 1) != 0) {
            puVar29 = (ushort *)(*(long *)(puVar10 + 0x58) + (long)iVar39 * 4);
          }
          uVar40 = (uint)*puVar29;
          uVar30 = (ulong)uVar40;
        } while (iVar22 <= (int)uVar40);
      }
      uVar38 = (uint)uVar30;
      local_e8[0].cache_avail = local_e8[0].cache_avail - (uint)*(byte *)(local_60 + uVar30);
    }
    uVar38 = uVar38 + 9;
  }
  else {
    uVar38 = uVar27 + 2;
  }
  if (uVar36 < (ulong)(long)(int)uVar38) goto LAB_0017019f;
  uVar26 = 0x15;
  uVar45 = local_13c;
  if (local_154 == 0) goto switchD_0016f253_default;
  if (local_154 == 2) {
    local_154 = 2;
    uVar45 = local_12c;
    uVar21 = local_13c;
    local_13c = local_12c;
    goto switchD_0016f253_default;
  }
  if (local_154 == 1) {
    local_154 = 1;
    uVar45 = local_140;
    uVar35 = local_13c;
    local_13c = local_140;
    goto switchD_0016f253_default;
  }
  local_98 = (ulong)*(uint *)(local_68 + 4 + (long)(int)local_154 * 8);
LAB_0016f675:
  wVar32 = (wchar_t)local_98;
  if ((cVar1 == '\x02') && (L'\x02' < wVar32)) {
    wVar32 = wVar32 + L'\xfffffffd';
    if (((wVar32 <= local_e8[0].cache_avail) ||
        (wVar15 = lzx_br_fillup(strm_00,local_e8), wVar15 != L'\0')) ||
       (uVar26 = 0x14, uVar45 = local_78, wVar32 <= local_e8[0].cache_avail)) {
      uVar28 = ((uint)(local_e8[0].cache_buffer >>
                      ((char)local_e8[0].cache_avail - (char)wVar32 & 0x3fU)) &
               cache_masks[(uint)wVar32]) * 8;
      wVar15 = (int)local_88 + wVar32;
      uVar26 = uVar33;
      if (((local_e8[0].cache_avail < wVar15) &&
          (wVar16 = lzx_br_fillup(strm_00,local_e8), wVar16 == L'\0')) &&
         (local_e8[0].cache_avail < wVar15)) {
        if (uVar25 == uVar23) {
          uVar35 = (uint)(local_e8[0].cache_buffer <<
                         ((char)local_88 - (char)(local_e8[0].cache_avail - wVar32) & 0x3fU)) &
                   cache_masks[local_88];
          uVar21 = puVar10[0x33];
          iVar22 = puVar10[0x1e];
          uVar4 = *(ushort *)
                   (*(long *)(puVar10 + 0x38) + (ulong)(uVar35 >> ((byte)uVar21 & 0x1f)) * 2);
          uVar40 = (uint)uVar4;
          uVar45 = uVar40;
          if (iVar22 <= (int)(uint)uVar4) {
            do {
              uVar45 = 0;
              if (((int)uVar21 < 1) || (iVar39 = uVar40 - iVar22, (int)puVar10[0x35] <= iVar39))
              break;
              uVar21 = uVar21 - 1;
              puVar29 = (ushort *)(*(long *)(puVar10 + 0x3a) + 2 + (long)iVar39 * 4);
              if ((uVar35 >> (uVar21 & 0x1f) & 1) != 0) {
                puVar29 = (ushort *)(*(long *)(puVar10 + 0x3a) + (long)iVar39 * 4);
              }
              uVar40 = (uint)*puVar29;
              uVar45 = uVar40;
            } while (iVar22 <= (int)uVar40);
          }
          local_e8[0].cache_avail =
               (local_e8[0].cache_avail - wVar32) - (uint)*(byte *)(local_70 + (ulong)uVar45);
          if (L'\xffffffff' < local_e8[0].cache_avail) goto LAB_0016f8ea;
          uVar45 = 8;
        }
        else {
          uVar45 = 7;
          uVar26 = 0x14;
        }
      }
      else {
        uVar21 = (uint)(local_e8[0].cache_buffer >>
                       ((char)(local_e8[0].cache_avail - wVar32) - (char)local_88 & 0x3fU)) &
                 cache_masks[local_88];
        uVar45 = puVar10[0x33];
        iVar22 = puVar10[0x1e];
        uVar4 = *(ushort *)
                 (*(long *)(puVar10 + 0x38) + (ulong)(uVar21 >> ((byte)uVar45 & 0x1f)) * 2);
        uVar30 = (ulong)uVar4;
        if (iVar22 <= (int)(uint)uVar4) {
          uVar42 = uVar30;
          do {
            uVar30 = 0;
            if (((int)uVar45 < 1) ||
               (iVar39 = (int)uVar42 - iVar22, uVar30 = 0, (int)puVar10[0x35] <= iVar39)) break;
            uVar45 = uVar45 - 1;
            puVar29 = (ushort *)(*(long *)(puVar10 + 0x3a) + 2 + (long)iVar39 * 4);
            if ((uVar21 >> (uVar45 & 0x1f) & 1) != 0) {
              puVar29 = (ushort *)(*(long *)(puVar10 + 0x3a) + (long)iVar39 * 4);
            }
            uVar30 = (ulong)*puVar29;
            uVar42 = uVar30;
          } while (iVar22 <= (int)(uint)*puVar29);
        }
        uVar45 = (uint)uVar30;
        local_e8[0].cache_avail =
             (local_e8[0].cache_avail - wVar32) - (uint)*(byte *)(local_70 + uVar30);
LAB_0016f8ea:
        uVar28 = uVar45 + uVar28;
        uVar45 = 0;
      }
    }
    uVar33 = uVar26;
    if (uVar45 != 0) {
      if (uVar45 == 7) goto LAB_0016fb72;
      if (uVar45 != 8) goto LAB_001701b4;
LAB_0017019f:
      puVar10[0x97] = 0xffffffe7;
      uVar45 = 0xffffffe7;
LAB_001701b4:
      lVar24 = local_38 - *(long *)((long)pvVar17 + 0x1a8);
      *(long *)((long)pvVar17 + 0x1a0) = *(long *)((long)pvVar17 + 0x1a0) + lVar24;
      *(long *)((long)pvVar17 + 0x1b0) = *(long *)((long)pvVar17 + 0x1b0) + lVar24;
      goto LAB_001701e0;
    }
  }
  else {
    if ((local_e8[0].cache_avail < wVar32) &&
       ((wVar32 = lzx_br_fillup(strm_00,local_e8), wVar32 == L'\0' &&
        (local_e8[0].cache_avail < (wchar_t)local_98)))) {
      uVar33 = 0x14;
      if (uVar25 == uVar23) goto LAB_0017019f;
      goto LAB_0016fb72;
    }
    local_e8[0].cache_avail = local_e8[0].cache_avail - (int)local_98;
    uVar28 = (uint)(local_e8[0].cache_buffer >> ((byte)local_e8[0].cache_avail & 0x3f)) &
             cache_masks[(int)local_98];
  }
  uVar28 = (uVar28 + *(int *)(local_68 + (long)(int)local_154 * 8)) - 2;
  local_12c = local_140;
  uVar45 = uVar28;
  local_140 = local_13c;
LAB_0016f924:
  local_13c = uVar45;
  uVar28 = uVar41 - uVar28 & uVar6;
switchD_0016f253_caseD_16:
  uVar26 = uVar33;
  do {
    uVar45 = uVar41;
    if ((int)uVar41 < (int)uVar28) {
      uVar45 = uVar28;
    }
    uVar21 = local_74 - uVar45;
    if ((int)uVar38 < (int)(local_74 - uVar45)) {
      uVar21 = uVar38;
    }
    if (puVar34 <= __dest + (int)uVar21) {
      uVar21 = (int)puVar34 - (int)__dest;
    }
    pvVar18 = (void *)((int)uVar28 + lVar24);
    if (((int)uVar21 < 8) ||
       (((int)uVar41 <= (int)(uVar21 + uVar28) && ((int)uVar28 <= (int)(uVar21 + uVar41))))) {
      if (0 < (int)uVar21) {
        uVar30 = 0;
        do {
          uVar2 = *(undefined1 *)((long)pvVar18 + uVar30);
          *(undefined1 *)((int)uVar41 + lVar24 + uVar30) = uVar2;
          __dest[uVar30] = uVar2;
          uVar30 = uVar30 + 1;
        } while (uVar21 != uVar30);
      }
    }
    else {
      local_40 = (size_t)uVar21;
      memcpy((void *)((int)uVar41 + lVar24),pvVar18,local_40);
      memcpy(__dest,pvVar18,local_40);
    }
    __dest = __dest + (int)uVar21;
    uVar28 = uVar28 + uVar21 & uVar6;
    uVar41 = uVar41 + uVar21 & uVar6;
    uVar36 = uVar36 - (long)(int)uVar21;
    uVar33 = 0x16;
    if (__dest < puVar34) {
      uVar33 = uVar26;
    }
    iVar22 = 7;
    if (__dest < puVar34) {
      iVar22 = 0;
    }
    uVar35 = uVar21;
    if ((int)uVar38 <= (int)uVar21) {
      uVar33 = uVar26;
      uVar35 = 0;
    }
    uVar45 = 10;
    if ((int)uVar38 <= (int)uVar21) {
      iVar22 = 10;
    }
    uVar38 = uVar38 - uVar35;
    uVar26 = uVar33;
  } while (iVar22 == 0);
  if (iVar22 != 7) {
    if (iVar22 != 10) goto LAB_001701b4;
    uVar26 = 0x12;
    uVar45 = uVar28;
    uVar21 = local_12c;
    uVar35 = local_140;
    goto switchD_0016f253_default;
  }
LAB_0016fb72:
  *local_58 = (int)local_e8[0].cache_buffer;
  local_58[1] = local_e8[0].cache_buffer._4_4_;
  local_58[2] = local_e8[0].cache_avail;
  local_58[3] = local_e8[0]._12_4_;
  *(ulong *)(puVar10 + 0xe) = uVar36;
  puVar10[8] = uVar38;
  puVar10[7] = uVar28;
  puVar10[0x15] = uVar27;
  puVar10[0x17] = (int)local_98;
  puVar10[0x16] = local_154;
  puVar10[0x10] = local_13c;
  puVar10[0x11] = local_140;
  puVar10[0x12] = local_12c;
  *puVar10 = uVar33;
  puVar10[6] = uVar41;
  *(long *)((long)pvVar17 + 0x1a8) = (long)puVar34 - (long)__dest;
  uVar45 = 0;
  goto LAB_001701b4;
switchD_0016efd6_caseD_4:
  uVar45 = piVar9[0x1c];
  if ((uVar45 & 0xf) == 0) {
    if ((((int)uVar45 < 0x10) && (wVar13 = lzx_br_fillup(strm_00,br), wVar13 == L'\0')) &&
       (piVar9[0x1c] < 0x10)) {
      *piVar9 = 4;
      goto LAB_00170133;
    }
    uVar45 = piVar9[0x1c] - 0x10;
  }
  else {
    uVar45 = uVar45 & 0xfffffff0;
  }
  piVar9[0x1c] = uVar45;
  piVar9[0x14] = 0;
  *piVar9 = 5;
switchD_0016efd6_caseD_5:
  do {
    iVar22 = piVar9[0x1c];
    if (iVar22 < 0x20) {
      if (0xf < iVar22) {
        uVar36 = br->cache_buffer;
        iVar43 = 2;
        iVar39 = -0x10;
        puVar34 = (undefined1 *)((long)piVar9 + 0x4d);
        piVar44 = piVar9 + 0x13;
        goto LAB_0016fc7f;
      }
    }
    else {
      uVar36 = *(ulong *)(piVar9 + 0x1a);
      uVar30 = uVar36 >> ((byte)(iVar22 + -0x10) & 0x3f);
      piVar9[0x1c] = iVar22 + -0x10;
      *(char *)(piVar9 + 0x13) = (char)uVar30;
      *(char *)((long)piVar9 + 0x4d) = (char)(uVar30 >> 8);
      iVar43 = 4;
      iVar39 = -0x20;
      puVar34 = (undefined1 *)((long)piVar9 + 0x4f);
      piVar44 = (int *)((long)piVar9 + 0x4e);
LAB_0016fc7f:
      uVar36 = uVar36 >> ((byte)(iVar22 + iVar39) & 0x3f);
      piVar9[0x1c] = iVar22 + iVar39;
      *(char *)piVar44 = (char)uVar36;
      *puVar34 = (char)(uVar36 >> 8);
      piVar9[0x14] = iVar43;
    }
    iVar22 = piVar9[0x14];
    if (((long)iVar22 < 4) && (*(char *)((long)piVar9 + 0x75) != '\0')) {
      piVar9[0x14] = iVar22 + 1;
      *(char *)((long)piVar9 + (long)iVar22 + 0x4c) = (char)piVar9[0x1d];
      *(undefined1 *)((long)piVar9 + 0x75) = 0;
    }
    iVar22 = piVar9[0x14];
    while (iVar22 < 4) {
      iVar39 = iVar14;
      if (*(long *)((long)pvVar17 + 400) < 1) goto LAB_0016fdb7;
      puVar34 = *(undefined1 **)((long)pvVar17 + 0x188);
      *(undefined1 **)((long)pvVar17 + 0x188) = puVar34 + 1;
      uVar2 = *puVar34;
      piVar9[0x14] = iVar22 + 1;
      *(undefined1 *)((long)piVar9 + (long)iVar22 + 0x4c) = uVar2;
      *(long *)((long)pvVar17 + 400) = *(long *)((long)pvVar17 + 400) + -1;
      iVar22 = piVar9[0x14];
    }
    piVar9[0x14] = 0;
    iVar22 = *piVar9;
    iVar39 = 0;
    if (iVar22 == 7) {
      uVar45 = (uint)*(byte *)((long)piVar9 + 0x4f) << 0x18;
      piVar9[0x12] = (uint)*(byte *)((long)piVar9 + 0x4d) << 8 |
                     (uint)*(byte *)((long)piVar9 + 0x4e) << 0x10 | (uint)*(byte *)(piVar9 + 0x13) |
                     uVar45;
      iVar22 = 8;
LAB_0016fdaa:
      if ((int)uVar45 < 0) {
        iVar39 = 5;
      }
      else {
        *piVar9 = iVar22;
      }
    }
    else {
      if (iVar22 == 6) {
        uVar45 = (uint)*(byte *)((long)piVar9 + 0x4f) << 0x18;
        piVar9[0x11] = (uint)*(byte *)((long)piVar9 + 0x4d) << 8 |
                       (uint)*(byte *)((long)piVar9 + 0x4e) << 0x10 | (uint)*(byte *)(piVar9 + 0x13)
                       | uVar45;
        iVar22 = 7;
        goto LAB_0016fdaa;
      }
      if (iVar22 == 5) {
        uVar45 = (uint)*(byte *)((long)piVar9 + 0x4f) << 0x18;
        piVar9[0x10] = (uint)*(byte *)((long)piVar9 + 0x4d) << 8 |
                       (uint)*(byte *)((long)piVar9 + 0x4e) << 0x10 | (uint)*(byte *)(piVar9 + 0x13)
                       | uVar45;
        iVar22 = 6;
        goto LAB_0016fdaa;
      }
    }
LAB_0016fdb7:
    if (iVar39 != 0) goto joined_r0x0016fea0;
  } while (*piVar9 != 8);
switchD_0016efd6_caseD_8:
  do {
    if (*(long *)(piVar9 + 0xe) == 0) goto switchD_0016efd6_caseD_9;
    uVar36 = *(ulong *)((long)pvVar17 + 0x1a8);
    if ((long)uVar36 < 1) {
      iVar39 = 1;
    }
    else {
      uVar30 = *(ulong *)((long)pvVar17 + 400);
      iVar39 = iVar14;
      if (0 < (long)uVar30) {
        uVar38 = (uint)*(long *)(piVar9 + 0xe);
        uVar45 = piVar9[1] - piVar9[6];
        if ((int)uVar38 <= piVar9[1] - piVar9[6]) {
          uVar45 = uVar38;
        }
        if ((long)(int)uVar45 <= (long)uVar36) {
          uVar36 = (ulong)uVar45;
        }
        if ((long)(int)uVar36 <= (long)uVar30) {
          uVar30 = uVar36 & 0xffffffff;
        }
        __n = (size_t)(int)uVar30;
        memcpy(*(void **)((long)pvVar17 + 0x1a0),*(void **)((long)pvVar17 + 0x188),__n);
        memcpy((void *)((long)piVar9[6] + *(long *)(piVar9 + 4)),*(void **)((long)pvVar17 + 0x188),
               __n);
        *(long *)((long)pvVar17 + 0x188) = *(long *)((long)pvVar17 + 0x188) + __n;
        *(long *)((long)pvVar17 + 400) = *(long *)((long)pvVar17 + 400) - __n;
        *(long *)((long)pvVar17 + 0x1a0) = *(long *)((long)pvVar17 + 0x1a0) + __n;
        *(long *)((long)pvVar17 + 0x1a8) = *(long *)((long)pvVar17 + 0x1a8) - __n;
        *(long *)((long)pvVar17 + 0x1b0) = *(long *)((long)pvVar17 + 0x1b0) + __n;
        piVar9[6] = piVar9[6] + (int)uVar30 & piVar9[2];
        *(size_t *)(piVar9 + 0xe) = *(long *)(piVar9 + 0xe) - __n;
        iVar39 = 0;
      }
    }
  } while (iVar39 == 0);
joined_r0x0016fea0:
  if (iVar39 != 5) {
LAB_00170153:
    uVar45 = 0;
    goto LAB_001701e0;
  }
LAB_0017013f:
  piVar9[0x97] = -0x19;
  uVar45 = 0xffffffe7;
  goto LAB_001701e0;
switchD_0016efd6_caseD_9:
  if ((*(byte *)(piVar9 + 0xc) & 1) != 0) {
    if (*(long *)((long)pvVar17 + 400) < 1) {
      *piVar9 = 9;
LAB_00170133:
      if (uVar25 != uVar23) goto LAB_00170153;
      goto LAB_0017013f;
    }
    *(long *)((long)pvVar17 + 0x188) = *(long *)((long)pvVar17 + 0x188) + 1;
    *(long *)((long)pvVar17 + 400) = *(long *)((long)pvVar17 + 400) + -1;
  }
  *piVar9 = 2;
  uVar45 = 1;
LAB_001701e0:
  if (uVar45 != 100) goto code_r0x001701e9;
  goto LAB_0016efab;
code_r0x001701e9:
  *(long *)((long)pvVar17 + 0x198) =
       *(long *)((long)pvVar17 + 0x198) + (uVar25 - *(long *)((long)pvVar17 + 400));
LAB_001701fc:
  if (1 < uVar45) {
    pcVar31 = "LZX decompression failed (%d)";
    goto LAB_001707a8;
  }
  iVar19 = *(int64_t *)((long)pvVar17 + 0x198);
  *(int64_t *)(lVar7 + 0x10) = iVar19;
  *(byte **)(lVar7 + 0x38) = local_90;
  iVar19 = cab_minimum_consume_cfdata(a,iVar19);
  if (iVar19 < 0) goto LAB_001707ee;
  uVar23 = *(ulong *)((long)pvVar17 + 0x1b0);
  uVar25 = (ulong)*(ushort *)(lVar7 + 8);
  if ((long)uVar25 <= (long)uVar23) goto LAB_0017024f;
  goto LAB_0016ee63;
}

Assistant:

static const void *
cab_read_ahead_cfdata(struct archive_read *a, ssize_t *avail)
{
	struct cab *cab = (struct cab *)(a->format->data);
	int err;

	err = cab_next_cfdata(a);
	if (err < ARCHIVE_OK) {
		*avail = err;
		return (NULL);
	}

	switch (cab->entry_cffolder->comptype) {
	case COMPTYPE_NONE:
		return (cab_read_ahead_cfdata_none(a, avail));
	case COMPTYPE_MSZIP:
		return (cab_read_ahead_cfdata_deflate(a, avail));
	case COMPTYPE_LZX:
		return (cab_read_ahead_cfdata_lzx(a, avail));
	default: /* Unsupported compression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported CAB compression : %s",
		    cab->entry_cffolder->compname);
		*avail = ARCHIVE_FAILED;
		return (NULL);
	}
}